

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33c8f::ParseBuildFileDelegate::loadedTarget
          (ParseBuildFileDelegate *this,StringRef name,Target *target)

{
  pointer ppNVar1;
  char *pcVar2;
  Node **node;
  pointer ppNVar3;
  StringRef local_60;
  string local_50;
  
  if (this->showOutput == true) {
    local_60.Data = (target->name)._M_dataplus._M_p;
    local_60.Length = (target->name)._M_string_length;
    llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
    printf("target(\'%s\')\n",local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    printf(" -- nodes: [");
    ppNVar1 = (target->nodes).
              super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = "";
    for (ppNVar3 = (target->nodes).
                   super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppNVar3 != ppNVar1;
        ppNVar3 = ppNVar3 + 1) {
      local_60.Data = ((*ppNVar3)->name)._M_dataplus._M_p;
      local_60.Length = ((*ppNVar3)->name)._M_string_length;
      llvm::StringRef::str_abi_cxx11_(&local_50,&local_60);
      printf("%s\'%s\'",pcVar2,local_50._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      pcVar2 = ", ";
    }
    puts("]");
  }
  return;
}

Assistant:

void ParseBuildFileDelegate::loadedTarget(StringRef name,
                                          const Target& target) {
  if (showOutput) {
    printf("target('%s')\n", target.getName().str().c_str());

    // Print the nodes in the target.
    bool first = true;
    printf(" -- nodes: [");
    for (const auto& node: target.getNodes()) {
      printf("%s'%s'", first ? "" : ", ", node->getName().str().c_str());
      first = false;
    }
    printf("]\n");
  }
}